

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hnsw.hpp
# Opt level: O1

MaxHeap * __thiscall
hnsw::HNSWIndex::SearchLayer
          (MaxHeap *__return_storage_ptr__,HNSWIndex *this,float *q,Point *ep,uint32_t ef,
          uint32_t layer)

{
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  float fVar1;
  uint uVar2;
  pointer __s;
  pointer puVar3;
  long lVar4;
  uint *puVar5;
  pointer ppVar6;
  float *pfVar7;
  bool bVar8;
  Point *neighbor;
  uint *puVar9;
  Point *neighbor_1;
  float fVar10;
  float dist;
  MinHeap candidates;
  float local_70;
  float local_6c;
  long local_68;
  ulong local_60;
  priority_queue<std::pair<unsigned_int,_float>,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_hnsw::PointGreaterComparator>
  local_58;
  float *local_38;
  
  (__return_storage_ptr__->super_MaxHeapImpl).c.
  super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super_MaxHeapImpl).c.
  super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super_MaxHeapImpl).c.
  super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.c.
  super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.c.
  super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.c.
  super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __s = (this->visited_).m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start;
  puVar3 = (this->visited_).m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_38 = q;
  if (__s != puVar3) {
    memset(__s,0,(long)puVar3 - (long)__s & 0xfffffffffffffff8);
  }
  local_60 = (ulong)ef;
  std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>::
  reserve((vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
           *)__return_storage_ptr__,local_60);
  this_00 = &this->visited_;
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::set
            (this_00,(ulong)ep->first,true);
  std::
  priority_queue<std::pair<unsigned_int,_float>,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_hnsw::PointGreaterComparator>
  ::push(&local_58,ep);
  std::
  priority_queue<std::pair<unsigned_int,_float>,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_hnsw::PointLessComparator>
  ::push(&__return_storage_ptr__->super_MaxHeapImpl,ep);
  local_68 = (ulong)layer * 3;
  do {
    if (local_58.c.
        super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_58.c.
        super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) break;
    uVar2 = (local_58.c.
             super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->first;
    fVar1 = (local_58.c.
             super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->second;
    std::
    priority_queue<std::pair<unsigned_int,_float>,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_hnsw::PointGreaterComparator>
    ::pop(&local_58);
    fVar10 = ((__return_storage_ptr__->super_MaxHeapImpl).c.
              super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->second;
    if (fVar10 < fVar1) break;
    lVar4 = *(long *)&(this->vertices_).
                      super__Vector_base<hnsw::HNSWIndex::Vertex,_std::allocator<hnsw::HNSWIndex::Vertex>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar2].neighbors.
                      super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                      ._M_impl;
    puVar5 = *(uint **)(lVar4 + 8 + local_68 * 8);
    local_6c = fVar10;
    for (puVar9 = *(uint **)(lVar4 + local_68 * 8); pfVar7 = local_38, puVar9 != puVar5;
        puVar9 = puVar9 + 2) {
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::test
                (this_00,(ulong)*puVar9);
    }
    lVar4 = *(long *)&(this->vertices_).
                      super__Vector_base<hnsw::HNSWIndex::Vertex,_std::allocator<hnsw::HNSWIndex::Vertex>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar2].neighbors.
                      super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                      ._M_impl;
    puVar5 = *(uint **)(lVar4 + 8 + local_68 * 8);
    for (puVar9 = *(uint **)(lVar4 + local_68 * 8); puVar9 != puVar5; puVar9 = puVar9 + 2) {
      bVar8 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::test
                        (this_00,(ulong)*puVar9);
      if (!bVar8) {
        boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::set
                  (this_00,(ulong)*puVar9,true);
        (**this->distance_->_vptr_Distance)
                  (this->distance_,
                   (this->points_).row_ptrs_.
                   super__Vector_base<const_float_*,_std::allocator<const_float_*>_>._M_impl.
                   super__Vector_impl_data._M_start[*puVar9],pfVar7);
        ppVar6 = (__return_storage_ptr__->super_MaxHeapImpl).c.
                 super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_70 = fVar10;
        if (((ulong)((long)(__return_storage_ptr__->super_MaxHeapImpl).c.
                           super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar6 >> 3) <
             local_60) || (fVar10 < ppVar6->second)) {
          std::
          priority_queue<std::pair<unsigned_int,float>,std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,hnsw::PointGreaterComparator>
          ::emplace<unsigned_int_const&,float&>
                    ((priority_queue<std::pair<unsigned_int,float>,std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,hnsw::PointGreaterComparator>
                      *)&local_58,puVar9,&local_70);
          std::
          priority_queue<std::pair<unsigned_int,float>,std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,hnsw::PointLessComparator>
          ::emplace<unsigned_int_const&,float&>
                    ((priority_queue<std::pair<unsigned_int,float>,std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,hnsw::PointLessComparator>
                      *)__return_storage_ptr__,puVar9,&local_70);
          if (local_60 <
              (ulong)((long)(__return_storage_ptr__->super_MaxHeapImpl).c.
                            super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(__return_storage_ptr__->super_MaxHeapImpl).c.
                            super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3)) {
            std::
            priority_queue<std::pair<unsigned_int,_float>,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_hnsw::PointLessComparator>
            ::pop(&__return_storage_ptr__->super_MaxHeapImpl);
          }
        }
      }
    }
  } while (fVar1 <= local_6c);
  if (local_58.c.
      super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.c.
                    super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

MaxHeap SearchLayer(const float *q, const Point &ep, uint32_t ef, uint32_t layer) {
    MaxHeap result;      // max heap
    MinHeap candidates;  // min heap
    visited_.reset();
    result.Container().reserve(ef);

    visited_.set(ep.first);
    candidates.push(ep);
    result.push(ep);

    while (!candidates.empty()) {
      Point p = candidates.top();
      candidates.pop();

      if (p.second > result.top().second) {
        break;
      }

#ifdef PREFETCH_DATA
      // prefetech into cache
      for (const Point &neighbor : vertices_[p.first].neighbors[layer]) {
        if (!visited_.test(neighbor.first)) {
          _mm_prefetch(points_[neighbor.first], _MM_HINT_T0);
        }
      }
#endif

      for (const Point &neighbor : vertices_[p.first].neighbors[layer]) {
        const index_t &edge = neighbor.first;
        if (visited_.test(neighbor.first)) {
          continue;
        }
        visited_.set(edge);
        float dist = distance_(points_[edge], q);
        if (result.size() < ef || dist < result.top().second) {
          candidates.emplace(edge, dist);
          result.emplace(edge, dist);
          if (result.size() > ef) {
            result.pop();
          }
        }
      }
    }

    return result;
  }